

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O2

bool tinyusdz::detail::ParseValue<std::array<float,4ul>>
               (AsciiParser *parser,float4 *ret,string *err)

{
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  unsigned_long *in_R8;
  allocator local_229;
  vector<float,_std::allocator<float>_> values;
  undefined1 local_208 [8];
  string local_200;
  string local_1e0;
  string local_1c0 [32];
  ostringstream ss_e;
  
  values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar1 = ascii::AsciiParser::SepBy1BasicType<float>(parser,',',&values);
  if (bVar1) {
    if ((long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start == 0x10) {
      ret->_M_elems[0] =
           *values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
            ._M_start;
      ret->_M_elems[1] =
           values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start[1];
      ret->_M_elems[2] =
           values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start[2];
      ret->_M_elems[3] =
           values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start[3];
      bVar1 = true;
      goto LAB_0023b5b2;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x129);
    ::std::operator<<(poVar2," ");
    ::std::__cxx11::string::string
              (local_1c0,"type `{}` expects the number of elements is 4, but got {}",&local_229);
    tinyusdz::value::TypeTraits<std::array<float,4ul>>::type_name_abi_cxx11_();
    local_208 = (undefined1  [8])
                ((long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2);
    fmt::format<std::__cxx11::string,unsigned_long>
              ((string *)(local_208 + 8),(fmt *)local_1c0,(string *)&local_1e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,in_R8)
    ;
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x123);
    ::std::operator<<(poVar2," ");
    ::std::__cxx11::string::string
              (local_1c0,"Failed to parse a value of type `{}`",(allocator *)local_208);
    tinyusdz::value::TypeTraits<std::array<float,4ul>>::type_name_abi_cxx11_();
    fmt::format<std::__cxx11::string>((string *)(local_208 + 8),(fmt *)local_1c0,&local_1e0,in_RCX);
  }
  poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)(local_208 + 8));
  ::std::operator<<(poVar2,"\n");
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  if (err != (string *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)err);
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
  bVar1 = false;
LAB_0023b5b2:
  ::std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&values.super__Vector_base<float,_std::allocator<float>_>);
  return bVar1;
}

Assistant:

bool ParseValue<value::float4>(tinyusdz::ascii::AsciiParser &parser,
                               value::float4 &ret, std::string *err) {
  std::vector<float> values;
  if (!parser.SepBy1BasicType(',', &values)) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Failed to parse a value of type `{}`",
                    value::TypeTraits<value::float4>::type_name()));
  }

  if (values.size() != 4) {
    PUSH_ERROR_AND_RETURN(fmt::format(
        "type `{}` expects the number of elements is 4, but got {}",
        value::TypeTraits<value::float4>::type_name(), values.size()));
  }

  ret[0] = values[0];
  ret[1] = values[1];
  ret[2] = values[2];
  ret[3] = values[3];

  return true;
}